

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

void __thiscall HighsSymmetryDetection::initializeGroundSet(HighsSymmetryDetection *this)

{
  pointer piVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar14;
  undefined1 auVar13 [16];
  value_type_conflict2 local_20 [2];
  undefined1 auVar12 [16];
  
  std::vector<int,_std::allocator<int>_>::operator=(&this->vertexGroundSet,&this->currentPartition);
  piVar1 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    uVar6 = (long)piVar2 - (long)piVar1 >> 2;
    iVar7 = 0;
    if (1 < uVar6) {
      iVar7 = 0;
      do {
        uVar6 = (long)uVar6 >> 1;
        iVar7 = iVar7 + 1;
      } while (1 < uVar6);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
              (piVar1,piVar2,iVar7,1);
  }
  local_20[1] = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->vertexPosition,
             (long)(this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,local_20 + 1);
  iVar7 = this->numVertices;
  if (0 < iVar7) {
    piVar1 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      piVar2[piVar1[lVar9]] = (int)lVar9;
      lVar9 = lVar9 + 1;
      iVar7 = this->numVertices;
    } while (lVar9 < iVar7);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->orbitPartition,(long)iVar7);
  auVar5 = _DAT_003c57d0;
  auVar4 = _DAT_003c57c0;
  auVar3 = _DAT_003c57b0;
  piVar1 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    uVar6 = (long)piVar2 + (-4 - (long)piVar1);
    auVar13._8_4_ = (int)uVar6;
    auVar13._0_8_ = uVar6;
    auVar13._12_4_ = (int)(uVar6 >> 0x20);
    auVar10._0_8_ = uVar6 >> 2;
    auVar10._8_8_ = auVar13._8_8_ >> 2;
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_003c57d0;
    do {
      iVar11 = (int)uVar8;
      auVar12._8_4_ = iVar11;
      auVar12._0_8_ = uVar8;
      auVar12._12_4_ = (int)(uVar8 >> 0x20);
      auVar13 = (auVar12 | auVar4) ^ auVar5;
      iVar7 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar7 && auVar10._0_4_ < auVar13._0_4_ || iVar7 < auVar13._4_4_)
                & 1)) {
        piVar1[uVar8] = iVar11;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        piVar1[uVar8 + 1] = iVar11 + 1;
      }
      auVar13 = (auVar12 | auVar3) ^ auVar5;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar7 && (iVar14 != iVar7 || auVar13._0_4_ <= auVar10._0_4_)) {
        piVar1[uVar8 + 2] = iVar11 + 2;
        piVar1[uVar8 + 3] = iVar11 + 3;
      }
      uVar8 = uVar8 + 4;
    } while (((uVar6 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
  }
  local_20[0] = 1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->orbitSize,(long)this->numVertices,local_20);
  std::vector<int,_std::allocator<int>_>::resize(&this->automorphisms,(long)this->numVertices << 6);
  this->numAutomorphisms = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->currNodeCertificate,(long)this->numVertices);
  return;
}

Assistant:

void HighsSymmetryDetection::initializeGroundSet() {
  vertexGroundSet = currentPartition;
  pdqsort(vertexGroundSet.begin(), vertexGroundSet.end());
  vertexPosition.resize(vertexToCell.size(), -1);
  for (HighsInt i = 0; i < numVertices; ++i)
    vertexPosition[vertexGroundSet[i]] = i;

  orbitPartition.resize(numVertices);
  std::iota(orbitPartition.begin(), orbitPartition.end(), 0);
  orbitSize.assign(numVertices, 1);

  automorphisms.resize(numVertices * 64);
  numAutomorphisms = 0;
  currNodeCertificate.reserve(numVertices);
}